

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen.h
# Opt level: O1

Object * __thiscall
flatbuffers::BaseBfbsGenerator::GetObjectByIndex(BaseBfbsGenerator *this,int32_t index)

{
  Schema *pSVar1;
  long lVar2;
  ushort uVar3;
  
  pSVar1 = this->schema_;
  if (-1 < index && pSVar1 != (Schema *)0x0) {
    lVar2 = -(long)*(int *)pSVar1;
    if (*(ushort *)(pSVar1 + -(long)*(int *)pSVar1) < 5) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(pSVar1 + lVar2 + 4);
    }
    if (index < *(int *)(pSVar1 + (ulong)*(uint *)(pSVar1 + uVar3) + (ulong)uVar3)) {
      if (*(ushort *)(pSVar1 + -(long)*(int *)pSVar1) < 5) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)(pSVar1 + lVar2 + 4);
      }
      if (uVar3 == 0) {
        pSVar1 = (Schema *)0x0;
      }
      else {
        pSVar1 = pSVar1 + (ulong)*(uint *)(pSVar1 + uVar3) + (ulong)uVar3;
      }
      if ((uint)index < *(uint *)pSVar1) {
        return (Object *)
               (pSVar1 + (ulong)*(uint *)(pSVar1 + (ulong)(uint)(index << 2) + 4) +
                         (ulong)(uint)(index << 2) + 4);
      }
      __assert_fail("i < size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                    ,0xc1,
                    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
                   );
    }
  }
  return (Object *)0x0;
}

Assistant:

const reflection::Object *GetObjectByIndex(int32_t index) const {
    if (!schema_ || index < 0 ||
        index >= static_cast<int32_t>(schema_->objects()->size())) {
      return nullptr;
    }
    return schema_->objects()->Get(index);
  }